

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.cpp
# Opt level: O3

void VOX_AddVoxel(int sprnum,int frame,FVoxelDef *def)

{
  uint amount;
  byte bVar1;
  spritedef_t *psVar2;
  spriteframe_t *psVar3;
  WORD WVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  undefined8 *puVar11;
  spriteframe_t *psVar12;
  spriteframe_t *psVar13;
  byte bVar14;
  
  psVar2 = sprites.Array;
  bVar14 = 0;
  bVar1 = sprites.Array[sprnum].numframes;
  if ((int)(uint)bVar1 <= frame) {
    amount = frame + 1;
    if ((bVar1 == 0) ||
       ((uint)sprites.Array[sprnum].spriteframes + (uint)bVar1 == SpriteFrames.Count)) {
      uVar10 = amount - bVar1;
      TArray<spriteframe_t,_spriteframe_t>::Grow(&SpriteFrames,uVar10);
      uVar5 = SpriteFrames.Count;
      uVar10 = uVar10 + SpriteFrames.Count;
      uVar6 = (uint)psVar2[sprnum].numframes;
      if (psVar2[sprnum].numframes == 0) {
        WVar4 = (WORD)SpriteFrames.Count;
        SpriteFrames.Count = uVar10;
        psVar2[sprnum].spriteframes = WVar4;
        uVar6 = 0;
        uVar10 = SpriteFrames.Count;
      }
    }
    else {
      TArray<spriteframe_t,_spriteframe_t>::Grow(&SpriteFrames,amount);
      uVar5 = SpriteFrames.Count;
      psVar3 = SpriteFrames.Array;
      SpriteFrames.Count = SpriteFrames.Count + amount;
      if (psVar2[sprnum].numframes == '\0') {
        uVar6 = 0;
        uVar9 = 0;
      }
      else {
        uVar9 = 0;
        psVar13 = SpriteFrames.Array;
        do {
          uVar7 = (ulong)((uint)psVar2[sprnum].spriteframes * 0x50);
          uVar10 = uVar5 + (int)uVar9;
          psVar3[uVar10].Flip = *(WORD *)((long)(psVar13->Texture + 0x10) + uVar7);
          puVar11 = (undefined8 *)((long)&((spriteframe_t *)(psVar13->Texture + -2))->Voxel + uVar7)
          ;
          psVar12 = psVar3 + uVar10;
          for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
            psVar12->Voxel = (FVoxelDef *)*puVar11;
            puVar11 = puVar11 + (ulong)bVar14 * -2 + 1;
            psVar12 = (spriteframe_t *)((long)psVar12 + (ulong)bVar14 * -0x10 + 8);
          }
          uVar9 = uVar9 + 1;
          uVar6 = (uint)psVar2[sprnum].numframes;
          psVar13 = psVar13 + 1;
        } while (uVar9 < psVar2[sprnum].numframes);
      }
      psVar2[sprnum].spriteframes = (WORD)uVar5;
      uVar5 = uVar5 + (int)uVar9;
      uVar10 = SpriteFrames.Count;
    }
    SpriteFrames.Count = uVar10;
    memset(SpriteFrames.Array + uVar5,0,(long)(int)(amount - uVar6) * 0x50);
    psVar2[sprnum].numframes = (BYTE)amount;
  }
  SpriteFrames.Array[(long)frame + (ulong)sprites.Array[sprnum].spriteframes].Voxel = def;
  return;
}

Assistant:

void VOX_AddVoxel(int sprnum, int frame, FVoxelDef *def)
{
	R_ExtendSpriteFrames(sprites[sprnum], frame);
	SpriteFrames[sprites[sprnum].spriteframes + frame].Voxel = def;
}